

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  float fVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  char cVar21;
  AABBNodeMB4D *node1;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong *puVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  float fVar32;
  float fVar35;
  float fVar36;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  vint4 bi;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_3;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 bi_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 ai_1;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  vint4 ai_3;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vint4 ai;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar72;
  float fVar73;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar74;
  float fVar75;
  float fVar79;
  float fVar80;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar81;
  undefined1 auVar82 [16];
  float fVar83;
  float fVar86;
  float fVar87;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar88;
  undefined1 auVar89 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar82._4_4_ = fVar3;
  auVar82._0_4_ = fVar3;
  auVar82._8_4_ = fVar3;
  auVar82._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar89._4_4_ = fVar4;
  auVar89._0_4_ = fVar4;
  auVar89._8_4_ = fVar4;
  auVar89._12_4_ = fVar4;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar12 = (tray->tnear).field_0.i[k];
  auVar69._4_4_ = iVar12;
  auVar69._0_4_ = iVar12;
  auVar69._8_4_ = iVar12;
  auVar69._12_4_ = iVar12;
  iVar12 = (tray->tfar).field_0.i[k];
  auVar76._4_4_ = iVar12;
  auVar76._0_4_ = iVar12;
  auVar76._8_4_ = iVar12;
  auVar76._12_4_ = iVar12;
  puVar28 = local_7d0;
LAB_00f0dc35:
  puVar27 = puVar28;
  if (puVar27 == &local_7d8) {
LAB_00f0e129:
    return puVar27 != &local_7d8;
  }
  puVar28 = puVar27 + -1;
  uVar29 = puVar27[-1];
  do {
    fVar13 = *(float *)(ray + k * 4 + 0x70);
    auVar31._4_4_ = fVar13;
    auVar31._0_4_ = fVar13;
    auVar31._8_4_ = fVar13;
    auVar31._12_4_ = fVar13;
    fVar19 = 1.0 - fVar13;
    auVar18 = vshufps_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),0);
    auVar43 = vshufps_avx(ZEXT416((uint)(fVar19 * 0.0)),ZEXT416((uint)(fVar19 * 0.0)),0);
    auVar39 = ZEXT1664(auVar43);
    do {
      if ((uVar29 & 8) != 0) {
        cVar21 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar29 & 0xfffffffffffffff0) * 0x40 + 0x18))
                           (pre,ray,k,context);
        if (cVar21 == '\0') goto LAB_00f0dc35;
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        goto LAB_00f0e129;
      }
      uVar23 = (uint)uVar29 & 7;
      uVar22 = uVar29 & 0xfffffffffffffff0;
      if (uVar23 == 3) {
        auVar70._0_4_ =
             fVar6 * *(float *)(uVar22 + 0x20) +
             *(float *)(uVar22 + 0x50) * fVar7 + *(float *)(uVar22 + 0x80) * fVar8;
        auVar70._4_4_ =
             fVar6 * *(float *)(uVar22 + 0x24) +
             *(float *)(uVar22 + 0x54) * fVar7 + *(float *)(uVar22 + 0x84) * fVar8;
        auVar70._8_4_ =
             fVar6 * *(float *)(uVar22 + 0x28) +
             *(float *)(uVar22 + 0x58) * fVar7 + *(float *)(uVar22 + 0x88) * fVar8;
        auVar70._12_4_ =
             fVar6 * *(float *)(uVar22 + 0x2c) +
             *(float *)(uVar22 + 0x5c) * fVar7 + *(float *)(uVar22 + 0x8c) * fVar8;
        auVar77._0_4_ =
             fVar6 * *(float *)(uVar22 + 0x30) +
             fVar7 * *(float *)(uVar22 + 0x60) + *(float *)(uVar22 + 0x90) * fVar8;
        auVar77._4_4_ =
             fVar6 * *(float *)(uVar22 + 0x34) +
             fVar7 * *(float *)(uVar22 + 100) + *(float *)(uVar22 + 0x94) * fVar8;
        auVar77._8_4_ =
             fVar6 * *(float *)(uVar22 + 0x38) +
             fVar7 * *(float *)(uVar22 + 0x68) + *(float *)(uVar22 + 0x98) * fVar8;
        auVar77._12_4_ =
             fVar6 * *(float *)(uVar22 + 0x3c) +
             fVar7 * *(float *)(uVar22 + 0x6c) + *(float *)(uVar22 + 0x9c) * fVar8;
        auVar84._0_4_ =
             fVar6 * *(float *)(uVar22 + 0x40) +
             fVar7 * *(float *)(uVar22 + 0x70) + *(float *)(uVar22 + 0xa0) * fVar8;
        auVar84._4_4_ =
             fVar6 * *(float *)(uVar22 + 0x44) +
             fVar7 * *(float *)(uVar22 + 0x74) + *(float *)(uVar22 + 0xa4) * fVar8;
        auVar84._8_4_ =
             fVar6 * *(float *)(uVar22 + 0x48) +
             fVar7 * *(float *)(uVar22 + 0x78) + *(float *)(uVar22 + 0xa8) * fVar8;
        auVar84._12_4_ =
             fVar6 * *(float *)(uVar22 + 0x4c) +
             fVar7 * *(float *)(uVar22 + 0x7c) + *(float *)(uVar22 + 0xac) * fVar8;
        auVar33._8_4_ = 0x7fffffff;
        auVar33._0_8_ = 0x7fffffff7fffffff;
        auVar33._12_4_ = 0x7fffffff;
        auVar43 = vandps_avx(auVar70,auVar33);
        auVar38._8_4_ = 0x219392ef;
        auVar38._0_8_ = 0x219392ef219392ef;
        auVar38._12_4_ = 0x219392ef;
        auVar43 = vcmpps_avx(auVar43,auVar38,1);
        auVar54 = vblendvps_avx(auVar70,auVar38,auVar43);
        auVar43 = vandps_avx(auVar77,auVar33);
        auVar43 = vcmpps_avx(auVar43,auVar38,1);
        auVar45 = vblendvps_avx(auVar77,auVar38,auVar43);
        auVar43 = vandps_avx(auVar84,auVar33);
        auVar43 = vcmpps_avx(auVar43,auVar38,1);
        auVar43 = vblendvps_avx(auVar84,auVar38,auVar43);
        auVar40 = ZEXT1664(auVar39._0_16_);
        auVar33 = vrcpps_avx(auVar54);
        fVar68 = auVar33._0_4_;
        auVar71._0_4_ = auVar54._0_4_ * fVar68;
        fVar72 = auVar33._4_4_;
        auVar71._4_4_ = auVar54._4_4_ * fVar72;
        fVar73 = auVar33._8_4_;
        auVar71._8_4_ = auVar54._8_4_ * fVar73;
        fVar74 = auVar33._12_4_;
        auVar71._12_4_ = auVar54._12_4_ * fVar74;
        auVar34._8_4_ = 0x3f800000;
        auVar34._0_8_ = 0x3f8000003f800000;
        auVar34._12_4_ = 0x3f800000;
        auVar54 = vsubps_avx(auVar34,auVar71);
        fVar68 = fVar68 + fVar68 * auVar54._0_4_;
        fVar72 = fVar72 + fVar72 * auVar54._4_4_;
        fVar73 = fVar73 + fVar73 * auVar54._8_4_;
        fVar74 = fVar74 + fVar74 * auVar54._12_4_;
        auVar54 = vrcpps_avx(auVar45);
        fVar75 = auVar54._0_4_;
        auVar78._0_4_ = auVar45._0_4_ * fVar75;
        fVar79 = auVar54._4_4_;
        auVar78._4_4_ = auVar45._4_4_ * fVar79;
        fVar80 = auVar54._8_4_;
        auVar78._8_4_ = auVar45._8_4_ * fVar80;
        fVar81 = auVar54._12_4_;
        auVar78._12_4_ = auVar45._12_4_ * fVar81;
        auVar54 = vsubps_avx(auVar34,auVar78);
        fVar75 = fVar75 + fVar75 * auVar54._0_4_;
        fVar79 = fVar79 + fVar79 * auVar54._4_4_;
        fVar80 = fVar80 + fVar80 * auVar54._8_4_;
        fVar81 = fVar81 + fVar81 * auVar54._12_4_;
        auVar54 = vrcpps_avx(auVar43);
        fVar83 = auVar54._0_4_;
        auVar85._0_4_ = auVar43._0_4_ * fVar83;
        fVar86 = auVar54._4_4_;
        auVar85._4_4_ = auVar43._4_4_ * fVar86;
        fVar87 = auVar54._8_4_;
        auVar85._8_4_ = auVar43._8_4_ * fVar87;
        fVar88 = auVar54._12_4_;
        auVar85._12_4_ = auVar43._12_4_ * fVar88;
        auVar43 = vsubps_avx(auVar34,auVar85);
        fVar83 = fVar83 + fVar83 * auVar43._0_4_;
        fVar86 = fVar86 + fVar86 * auVar43._4_4_;
        fVar87 = fVar87 + fVar87 * auVar43._8_4_;
        fVar88 = fVar88 + fVar88 * auVar43._12_4_;
        auVar54._0_4_ =
             fVar4 * *(float *)(uVar22 + 0x50) +
             *(float *)(uVar22 + 0x80) * fVar5 + *(float *)(uVar22 + 0xb0) +
             fVar3 * *(float *)(uVar22 + 0x20);
        auVar54._4_4_ =
             fVar4 * *(float *)(uVar22 + 0x54) +
             *(float *)(uVar22 + 0x84) * fVar5 + *(float *)(uVar22 + 0xb4) +
             fVar3 * *(float *)(uVar22 + 0x24);
        auVar54._8_4_ =
             fVar4 * *(float *)(uVar22 + 0x58) +
             *(float *)(uVar22 + 0x88) * fVar5 + *(float *)(uVar22 + 0xb8) +
             fVar3 * *(float *)(uVar22 + 0x28);
        auVar54._12_4_ =
             fVar4 * *(float *)(uVar22 + 0x5c) +
             *(float *)(uVar22 + 0x8c) * fVar5 + *(float *)(uVar22 + 0xbc) +
             fVar3 * *(float *)(uVar22 + 0x2c);
        auVar48._0_4_ =
             fVar3 * *(float *)(uVar22 + 0x30) +
             *(float *)(uVar22 + 0x90) * fVar5 + *(float *)(uVar22 + 0xc0) +
             fVar4 * *(float *)(uVar22 + 0x60);
        auVar48._4_4_ =
             fVar3 * *(float *)(uVar22 + 0x34) +
             *(float *)(uVar22 + 0x94) * fVar5 + *(float *)(uVar22 + 0xc4) +
             fVar4 * *(float *)(uVar22 + 100);
        auVar48._8_4_ =
             fVar3 * *(float *)(uVar22 + 0x38) +
             *(float *)(uVar22 + 0x98) * fVar5 + *(float *)(uVar22 + 200) +
             fVar4 * *(float *)(uVar22 + 0x68);
        auVar48._12_4_ =
             fVar3 * *(float *)(uVar22 + 0x3c) +
             *(float *)(uVar22 + 0x9c) * fVar5 + *(float *)(uVar22 + 0xcc) +
             fVar4 * *(float *)(uVar22 + 0x6c);
        fVar19 = auVar39._0_4_;
        auVar43._0_4_ = fVar13 * *(float *)(uVar22 + 0xe0) + fVar19;
        fVar15 = auVar39._4_4_;
        auVar43._4_4_ = fVar13 * *(float *)(uVar22 + 0xe4) + fVar15;
        fVar16 = auVar39._8_4_;
        auVar43._8_4_ = fVar13 * *(float *)(uVar22 + 0xe8) + fVar16;
        fVar17 = auVar39._12_4_;
        auVar43._12_4_ = fVar13 * *(float *)(uVar22 + 0xec) + fVar17;
        auVar65._0_4_ = fVar13 * *(float *)(uVar22 + 0xf0) + fVar19;
        auVar65._4_4_ = fVar13 * *(float *)(uVar22 + 0xf4) + fVar15;
        auVar65._8_4_ = fVar13 * *(float *)(uVar22 + 0xf8) + fVar16;
        auVar65._12_4_ = fVar13 * *(float *)(uVar22 + 0xfc) + fVar17;
        auVar44._0_4_ =
             fVar3 * *(float *)(uVar22 + 0x40) +
             *(float *)(uVar22 + 0xa0) * fVar5 + *(float *)(uVar22 + 0xd0) +
             fVar4 * *(float *)(uVar22 + 0x70);
        auVar44._4_4_ =
             fVar3 * *(float *)(uVar22 + 0x44) +
             *(float *)(uVar22 + 0xa4) * fVar5 + *(float *)(uVar22 + 0xd4) +
             fVar4 * *(float *)(uVar22 + 0x74);
        auVar44._8_4_ =
             fVar3 * *(float *)(uVar22 + 0x48) +
             *(float *)(uVar22 + 0xa8) * fVar5 + *(float *)(uVar22 + 0xd8) +
             fVar4 * *(float *)(uVar22 + 0x78);
        auVar44._12_4_ =
             fVar3 * *(float *)(uVar22 + 0x4c) +
             *(float *)(uVar22 + 0xac) * fVar5 + *(float *)(uVar22 + 0xdc) +
             fVar4 * *(float *)(uVar22 + 0x7c);
        fVar32 = auVar18._0_4_;
        auVar58._0_4_ = fVar32 + fVar13 * *(float *)(uVar22 + 0x110);
        fVar35 = auVar18._4_4_;
        auVar58._4_4_ = fVar35 + fVar13 * *(float *)(uVar22 + 0x114);
        fVar36 = auVar18._8_4_;
        auVar58._8_4_ = fVar36 + fVar13 * *(float *)(uVar22 + 0x118);
        fVar37 = auVar18._12_4_;
        auVar58._12_4_ = fVar37 + fVar13 * *(float *)(uVar22 + 0x11c);
        auVar43 = vsubps_avx(auVar43,auVar54);
        auVar54 = vsubps_avx(auVar58,auVar54);
        auVar67._0_4_ = fVar13 * *(float *)(uVar22 + 0x100) + fVar19;
        auVar67._4_4_ = fVar13 * *(float *)(uVar22 + 0x104) + fVar15;
        auVar67._8_4_ = fVar13 * *(float *)(uVar22 + 0x108) + fVar16;
        auVar67._12_4_ = fVar13 * *(float *)(uVar22 + 0x10c) + fVar17;
        auVar59._0_4_ = fVar32 + fVar13 * *(float *)(uVar22 + 0x120);
        auVar59._4_4_ = fVar35 + fVar13 * *(float *)(uVar22 + 0x124);
        auVar59._8_4_ = fVar36 + fVar13 * *(float *)(uVar22 + 0x128);
        auVar59._12_4_ = fVar37 + fVar13 * *(float *)(uVar22 + 300);
        auVar45 = vsubps_avx(auVar65,auVar48);
        auVar33 = vsubps_avx(auVar59,auVar48);
        auVar60._0_4_ = fVar32 + fVar13 * *(float *)(uVar22 + 0x130);
        auVar60._4_4_ = fVar35 + fVar13 * *(float *)(uVar22 + 0x134);
        auVar60._8_4_ = fVar36 + fVar13 * *(float *)(uVar22 + 0x138);
        auVar60._12_4_ = fVar37 + fVar13 * *(float *)(uVar22 + 0x13c);
        auVar34 = vsubps_avx(auVar67,auVar44);
        auVar38 = vsubps_avx(auVar60,auVar44);
        auVar61._0_4_ = fVar68 * auVar43._0_4_;
        auVar61._4_4_ = fVar72 * auVar43._4_4_;
        auVar61._8_4_ = fVar73 * auVar43._8_4_;
        auVar61._12_4_ = fVar74 * auVar43._12_4_;
        auVar55._0_4_ = fVar68 * auVar54._0_4_;
        auVar55._4_4_ = fVar72 * auVar54._4_4_;
        auVar55._8_4_ = fVar73 * auVar54._8_4_;
        auVar55._12_4_ = fVar74 * auVar54._12_4_;
        auVar64._0_4_ = auVar45._0_4_ * fVar75;
        auVar64._4_4_ = auVar45._4_4_ * fVar79;
        auVar64._8_4_ = auVar45._8_4_ * fVar80;
        auVar64._12_4_ = auVar45._12_4_ * fVar81;
        auVar66._0_4_ = auVar34._0_4_ * fVar83;
        auVar66._4_4_ = auVar34._4_4_ * fVar86;
        auVar66._8_4_ = auVar34._8_4_ * fVar87;
        auVar66._12_4_ = auVar34._12_4_ * fVar88;
        auVar49._0_4_ = fVar75 * auVar33._0_4_;
        auVar49._4_4_ = fVar79 * auVar33._4_4_;
        auVar49._8_4_ = fVar80 * auVar33._8_4_;
        auVar49._12_4_ = fVar81 * auVar33._12_4_;
        auVar45._0_4_ = fVar83 * auVar38._0_4_;
        auVar45._4_4_ = fVar86 * auVar38._4_4_;
        auVar45._8_4_ = fVar87 * auVar38._8_4_;
        auVar45._12_4_ = fVar88 * auVar38._12_4_;
        auVar43 = vpminsd_avx(auVar64,auVar49);
        auVar54 = vpminsd_avx(auVar66,auVar45);
        auVar43 = vmaxps_avx(auVar43,auVar54);
        auVar34 = vpminsd_avx(auVar61,auVar55);
        auVar33 = vpmaxsd_avx(auVar61,auVar55);
        auVar54 = vpmaxsd_avx(auVar64,auVar49);
        auVar45 = vpmaxsd_avx(auVar66,auVar45);
        auVar45 = vminps_avx(auVar54,auVar45);
        auVar54 = vmaxps_avx(auVar69,auVar34);
        auVar43 = vmaxps_avx(auVar54,auVar43);
        auVar54 = vminps_avx(auVar76,auVar33);
        auVar54 = vminps_avx(auVar54,auVar45);
        auVar43 = vcmpps_avx(auVar43,auVar54,2);
      }
      else {
        pfVar2 = (float *)(uVar22 + 0x80 + uVar25);
        pfVar1 = (float *)(uVar22 + 0x20 + uVar25);
        auVar41._0_4_ = fVar13 * *pfVar2 + *pfVar1;
        auVar41._4_4_ = fVar13 * pfVar2[1] + pfVar1[1];
        auVar41._8_4_ = fVar13 * pfVar2[2] + pfVar1[2];
        auVar41._12_4_ = fVar13 * pfVar2[3] + pfVar1[3];
        auVar43 = vsubps_avx(auVar41,auVar82);
        pfVar2 = (float *)(uVar22 + 0x80 + uVar30);
        auVar42._0_4_ = fVar9 * auVar43._0_4_;
        auVar42._4_4_ = fVar9 * auVar43._4_4_;
        auVar42._8_4_ = fVar9 * auVar43._8_4_;
        auVar42._12_4_ = fVar9 * auVar43._12_4_;
        pfVar1 = (float *)(uVar22 + 0x20 + uVar30);
        auVar46._0_4_ = fVar13 * *pfVar2 + *pfVar1;
        auVar46._4_4_ = fVar13 * pfVar2[1] + pfVar1[1];
        auVar46._8_4_ = fVar13 * pfVar2[2] + pfVar1[2];
        auVar46._12_4_ = fVar13 * pfVar2[3] + pfVar1[3];
        auVar43 = vsubps_avx(auVar46,auVar89);
        pfVar2 = (float *)(uVar22 + 0x80 + uVar26);
        pfVar1 = (float *)(uVar22 + 0x20 + uVar26);
        auVar50._0_4_ = fVar13 * *pfVar2 + *pfVar1;
        auVar50._4_4_ = fVar13 * pfVar2[1] + pfVar1[1];
        auVar50._8_4_ = fVar13 * pfVar2[2] + pfVar1[2];
        auVar50._12_4_ = fVar13 * pfVar2[3] + pfVar1[3];
        auVar47._0_4_ = fVar10 * auVar43._0_4_;
        auVar47._4_4_ = fVar10 * auVar43._4_4_;
        auVar47._8_4_ = fVar10 * auVar43._8_4_;
        auVar47._12_4_ = fVar10 * auVar43._12_4_;
        auVar20._4_4_ = fVar5;
        auVar20._0_4_ = fVar5;
        auVar20._8_4_ = fVar5;
        auVar20._12_4_ = fVar5;
        auVar43 = vsubps_avx(auVar50,auVar20);
        auVar51._0_4_ = fVar11 * auVar43._0_4_;
        auVar51._4_4_ = fVar11 * auVar43._4_4_;
        auVar51._8_4_ = fVar11 * auVar43._8_4_;
        auVar51._12_4_ = fVar11 * auVar43._12_4_;
        auVar43 = vmaxps_avx(auVar47,auVar51);
        pfVar2 = (float *)(uVar22 + 0x80 + (uVar25 ^ 0x10));
        pfVar1 = (float *)(uVar22 + 0x20 + (uVar25 ^ 0x10));
        auVar52._0_4_ = fVar13 * *pfVar2 + *pfVar1;
        auVar52._4_4_ = fVar13 * pfVar2[1] + pfVar1[1];
        auVar52._8_4_ = fVar13 * pfVar2[2] + pfVar1[2];
        auVar52._12_4_ = fVar13 * pfVar2[3] + pfVar1[3];
        auVar54 = vsubps_avx(auVar52,auVar82);
        auVar53._0_4_ = fVar9 * auVar54._0_4_;
        auVar53._4_4_ = fVar9 * auVar54._4_4_;
        auVar53._8_4_ = fVar9 * auVar54._8_4_;
        auVar53._12_4_ = fVar9 * auVar54._12_4_;
        pfVar2 = (float *)(uVar22 + 0x80 + (uVar30 ^ 0x10));
        pfVar1 = (float *)(uVar22 + 0x20 + (uVar30 ^ 0x10));
        auVar56._0_4_ = fVar13 * *pfVar2 + *pfVar1;
        auVar56._4_4_ = fVar13 * pfVar2[1] + pfVar1[1];
        auVar56._8_4_ = fVar13 * pfVar2[2] + pfVar1[2];
        auVar56._12_4_ = fVar13 * pfVar2[3] + pfVar1[3];
        auVar54 = vsubps_avx(auVar56,auVar89);
        auVar57._0_4_ = fVar10 * auVar54._0_4_;
        auVar57._4_4_ = fVar10 * auVar54._4_4_;
        auVar57._8_4_ = fVar10 * auVar54._8_4_;
        auVar57._12_4_ = fVar10 * auVar54._12_4_;
        pfVar2 = (float *)(uVar22 + 0x80 + (uVar26 ^ 0x10));
        pfVar1 = (float *)(uVar22 + 0x20 + (uVar26 ^ 0x10));
        auVar62._0_4_ = fVar13 * *pfVar2 + *pfVar1;
        auVar62._4_4_ = fVar13 * pfVar2[1] + pfVar1[1];
        auVar62._8_4_ = fVar13 * pfVar2[2] + pfVar1[2];
        auVar62._12_4_ = fVar13 * pfVar2[3] + pfVar1[3];
        auVar54 = vsubps_avx(auVar62,auVar20);
        auVar63._0_4_ = fVar11 * auVar54._0_4_;
        auVar63._4_4_ = fVar11 * auVar54._4_4_;
        auVar63._8_4_ = fVar11 * auVar54._8_4_;
        auVar63._12_4_ = fVar11 * auVar54._12_4_;
        auVar45 = vminps_avx(auVar57,auVar63);
        auVar54 = vmaxps_avx(auVar69,auVar42);
        auVar43 = vmaxps_avx(auVar54,auVar43);
        auVar54 = vminps_avx(auVar76,auVar53);
        auVar54 = vminps_avx(auVar54,auVar45);
        auVar43 = vcmpps_avx(auVar43,auVar54,2);
        auVar40 = auVar39;
        if (uVar23 == 6) {
          auVar54 = vcmpps_avx(*(undefined1 (*) [16])(uVar22 + 0xe0),auVar31,2);
          auVar45 = vcmpps_avx(auVar31,*(undefined1 (*) [16])(uVar22 + 0xf0),1);
          auVar54 = vandps_avx(auVar54,auVar45);
          auVar43 = vandps_avx(auVar54,auVar43);
        }
      }
      auVar43 = vpslld_avx(auVar43,0x1f);
      uVar23 = vmovmskps_avx(auVar43);
      if (uVar23 == 0) goto LAB_00f0dc35;
      uVar23 = uVar23 & 0xff;
      lVar14 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      uVar29 = *(ulong *)(uVar22 + lVar14 * 8);
      uVar23 = uVar23 - 1 & uVar23;
      uVar24 = (ulong)uVar23;
      auVar39 = auVar40;
    } while (uVar23 == 0);
    do {
      *puVar28 = uVar29;
      puVar28 = puVar28 + 1;
      lVar14 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      uVar29 = *(ulong *)(uVar22 + lVar14 * 8);
      uVar24 = uVar24 - 1 & uVar24;
    } while (uVar24 != 0);
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }